

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall DLevelScript::Link(DLevelScript *this)

{
  DLevelScript *pointed;
  anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1 pointing;
  
  if (DACSThinker::ActiveThinker.field_0 == (DACSThinker *)0x0) {
LAB_003bca87:
    pointing.p = (DACSThinker *)0x0;
  }
  else {
    pointing = DACSThinker::ActiveThinker.field_0;
    if ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) != 0) {
      DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
      goto LAB_003bca87;
    }
  }
  pointed = (pointing.p)->Scripts;
  this->next = pointed;
  if (pointed != (DLevelScript *)0x0) {
    if ((((pointed->super_DObject).ObjectFlags & 3) != 0) &&
       (((this->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&this->super_DObject,&pointed->super_DObject);
      pointed = (pointing.p)->Scripts;
      if (pointed == (DLevelScript *)0x0) goto LAB_003bcacf;
    }
    pointed->prev = this;
    if ((((this->super_DObject).ObjectFlags & 3) != 0) &&
       (((pointed->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pointed->super_DObject,&this->super_DObject);
    }
  }
LAB_003bcacf:
  this->prev = (DLevelScript *)0x0;
  (pointing.p)->Scripts = this;
  if ((((this->super_DObject).ObjectFlags & 3) != 0) &&
     ((((pointing.p)->super_DThinker).super_DObject.ObjectFlags & 4) != 0)) {
    GC::Barrier(pointing.o,&this->super_DObject);
  }
  if ((pointing.p)->LastScript == (DLevelScript *)0x0) {
    (pointing.p)->LastScript = this;
  }
  return;
}

Assistant:

void DLevelScript::Link ()
{
	DACSThinker *controller = DACSThinker::ActiveThinker;

	next = controller->Scripts;
	GC::WriteBarrier(this, next);
	if (controller->Scripts)
	{
		controller->Scripts->prev = this;
		GC::WriteBarrier(controller->Scripts, this);
	}
	prev = NULL;
	controller->Scripts = this;
	GC::WriteBarrier(controller, this);
	if (controller->LastScript == NULL)
	{
		controller->LastScript = this;
	}
}